

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNodeChain<QByteArray>::free(MultiNodeChain<QByteArray> *this,void *__ptr)

{
  MultiNodeChain<QByteArray> *pMVar1;
  MultiNodeChain<QByteArray> *n;
  MultiNodeChain<QByteArray> *e;
  qsizetype nEntries;
  MultiNodeChain<QByteArray> *local_18;
  
  pMVar1 = this;
  while (local_18 = pMVar1, local_18 != (MultiNodeChain<QByteArray> *)0x0) {
    pMVar1 = local_18->next;
    if (local_18 != (MultiNodeChain<QByteArray> *)0x0) {
      ~MultiNodeChain((MultiNodeChain<QByteArray> *)0x125d1c);
      operator_delete(local_18,0x20);
    }
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }